

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::GetSectionHeaderByName(int fd,char *name,size_t name_len,Elf64_Shdr *out)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Elf64_Off offset;
  ulong uVar5;
  Elf64_Ehdr elf_header;
  char header_name [64];
  Elf64_Shdr shstrtab;
  
  bVar2 = false;
  bVar1 = ReadFromOffsetExact(fd,&elf_header,0x40,0);
  if (bVar1) {
    bVar2 = ReadFromOffsetExact(fd,&shstrtab,0x40,
                                (ulong)elf_header.e_shstrndx * (ulong)elf_header.e_shentsize +
                                elf_header.e_shoff);
    if (bVar2) {
      offset = elf_header.e_shoff;
      for (uVar5 = 0; elf_header.e_shnum != uVar5; uVar5 = uVar5 + 1) {
        bVar2 = ReadFromOffsetExact(fd,out,0x40,offset);
        if (!bVar2) break;
        if (0x40 < name_len) {
          bVar2 = false;
          RawLog__(GLOG_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/symbolize.cc"
                   ,0x10e,
                   "Section name \'%s\' is too long (%zu); section will not be found (even if present)."
                   ,name,name_len);
          goto LAB_0011b685;
        }
        sVar4 = ReadFromOffset(fd,header_name,name_len,out->sh_name + shstrtab.sh_offset);
        bVar2 = sVar4 != 0xffffffffffffffff;
        if (sVar4 == 0xffffffffffffffff) goto LAB_0011b685;
        if (sVar4 == name_len) {
          iVar3 = bcmp(header_name,name,name_len);
          if (iVar3 == 0) goto LAB_0011b685;
        }
        offset = offset + elf_header.e_shentsize;
      }
      bVar2 = false;
LAB_0011b685:
      bVar2 = (bool)(uVar5 < elf_header.e_shnum & bVar2);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool GetSectionHeaderByName(int fd, const char* name, size_t name_len,
                            ElfW(Shdr) * out) {
  ElfW(Ehdr) elf_header;
  if (!ReadFromOffsetExact(fd, &elf_header, sizeof(elf_header), 0)) {
    return false;
  }

  ElfW(Shdr) shstrtab;
  size_t shstrtab_offset =
      (elf_header.e_shoff + static_cast<size_t>(elf_header.e_shentsize) *
                                static_cast<size_t>(elf_header.e_shstrndx));
  if (!ReadFromOffsetExact(fd, &shstrtab, sizeof(shstrtab), shstrtab_offset)) {
    return false;
  }

  for (size_t i = 0; i < elf_header.e_shnum; ++i) {
    size_t section_header_offset =
        (elf_header.e_shoff + elf_header.e_shentsize * i);
    if (!ReadFromOffsetExact(fd, out, sizeof(*out), section_header_offset)) {
      return false;
    }
    char header_name[kMaxSectionNameLen];
    if (sizeof(header_name) < name_len) {
      RAW_LOG(WARNING,
              "Section name '%s' is too long (%zu); "
              "section will not be found (even if present).",
              name, name_len);
      // No point in even trying.
      return false;
    }
    size_t name_offset = shstrtab.sh_offset + out->sh_name;
    ssize_t n_read = ReadFromOffset(fd, &header_name, name_len, name_offset);
    if (n_read == -1) {
      return false;
    } else if (static_cast<size_t>(n_read) != name_len) {
      // Short read -- name could be at end of file.
      continue;
    }
    if (memcmp(header_name, name, name_len) == 0) {
      return true;
    }
  }
  return false;
}